

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O2

time_ms_t __thiscall Container::get_time_usage_ms(Container *this)

{
  CgroupController *pCVar1;
  longlong lVar2;
  size_t in_RCX;
  allocator<char> local_49;
  string local_48 [32];
  string data;
  
  pCVar1 = this->cpuacct_controller_;
  std::__cxx11::string::string<std::allocator<char>>(local_48,"cpuacct.usage",&local_49);
  CgroupController::read((CgroupController *)&data,(int)pCVar1,local_48,in_RCX);
  std::__cxx11::string::~string(local_48);
  lVar2 = std::__cxx11::stoll(&data,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&data);
  return lVar2 / 1000000;
}

Assistant:

time_ms_t Container::get_time_usage_ms() {
    std::string data = cpuacct_controller_->read("cpuacct.usage");
    return stoll(data) / 1000000;
}